

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-mltpctive-dynamical-system.cpp
# Opt level: O1

void __thiscall
stateObservation::IMUMltpctiveDynamicalSystem::stateSum
          (IMUMltpctiveDynamicalSystem *this,Vector *stateVector,Vector *tangentVector,Vector *sum)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  PointerType ptr;
  double *pdVar7;
  undefined8 *puVar8;
  char *__function;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  Packet2d b_xy;
  double dVar14;
  double dVar15;
  undefined1 local_58 [16];
  double local_48;
  
  if ((sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 0x13
     ) {
    free((sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data);
    pdVar7 = (double *)malloc(0x98);
    if (((ulong)pdVar7 & 0xf) != 0) {
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                    "void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (pdVar7 == (double *)0x0) {
      puVar8 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar8 = operator_delete;
      __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    (sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data = pdVar7;
  }
  (sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 0x13;
  if ((2 < (stateVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_rows) &&
     (2 < (tangentVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows)) {
    pdVar7 = (stateVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
             .m_data;
    pdVar1 = (tangentVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
             m_storage.m_data;
    pdVar2 = (sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    dVar9 = pdVar7[1];
    dVar12 = pdVar1[1];
    *pdVar2 = *pdVar1 + *pdVar7;
    pdVar2[1] = dVar12 + dVar9;
    pdVar2[2] = pdVar7[2] + pdVar1[2];
    if ((9 < (stateVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
             .m_rows) &&
       (8 < (tangentVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
            m_storage.m_rows)) {
      if ((sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <
          10) {
LAB_001491e4:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, 1>, 3, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
        ;
        goto LAB_00149227;
      }
      pdVar7 = (stateVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
               m_storage.m_data;
      pdVar1 = (tangentVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
               m_storage.m_data;
      pdVar2 = (sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      dVar9 = pdVar7[8];
      dVar12 = pdVar1[7];
      pdVar2[7] = pdVar1[6] + pdVar7[7];
      pdVar2[8] = dVar12 + dVar9;
      pdVar2[9] = pdVar7[9] + pdVar1[8];
      if ((0xf < (stateVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_rows) &&
         (0xe < (tangentVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                m_storage.m_rows)) {
        if ((sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <
            0x10) goto LAB_001491e4;
        pdVar7 = (stateVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        pdVar1 = (tangentVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        pdVar2 = (sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        dVar9 = pdVar7[0xe];
        dVar12 = pdVar1[0xd];
        pdVar2[0xd] = pdVar1[0xc] + pdVar7[0xd];
        pdVar2[0xe] = dVar12 + dVar9;
        pdVar2[0xf] = pdVar7[0xf] + pdVar1[0xe];
        if (5 < (tangentVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                m_storage.m_rows) {
          pdVar7 = (tangentVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
          auVar11 = *(undefined1 (*) [16])(pdVar7 + 3);
          local_48 = pdVar7[5];
          dVar9 = local_48 * local_48 +
                  auVar11._8_8_ * auVar11._8_8_ + auVar11._0_8_ * auVar11._0_8_;
          dVar12 = 0.0;
          if (dVar9 <= 9.999999999999999e-33) {
            local_48 = 1.0;
            local_58 = ZEXT816(0);
          }
          else {
            if (dVar9 < 0.0) {
              dVar9 = sqrt(dVar9);
            }
            else {
              dVar9 = SQRT(dVar9);
            }
            auVar10._8_8_ = dVar9;
            auVar10._0_8_ = dVar9;
            local_58 = divpd(auVar11,auVar10);
            local_48 = local_48 / dVar9;
            dVar12 = dVar9 * 0.5;
          }
          dVar9 = cos(dVar12);
          dVar12 = sin(dVar12);
          if ((stateVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
              m_storage.m_rows < 7) {
            __function = 
            "Eigen::Block<const Eigen::Matrix<double, -1, 1>, 4, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = 4, BlockCols = 1, InnerPanel = false]"
            ;
            goto LAB_00149227;
          }
          if ((sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              < 7) {
            __function = 
            "Eigen::Block<Eigen::Matrix<double, -1, 1>, 4, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = 4, BlockCols = 1, InnerPanel = false]"
            ;
            goto LAB_00149227;
          }
          pdVar7 = (sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
          pdVar1 = (stateVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
          dVar3 = pdVar1[3];
          dVar4 = pdVar1[4];
          dVar5 = pdVar1[5];
          dVar6 = pdVar1[6];
          dVar14 = (double)local_58._0_8_ * dVar12;
          dVar15 = (double)local_58._8_8_ * dVar12;
          local_48 = local_48 * dVar12;
          dVar12 = local_48 * dVar5 + dVar14 * dVar3;
          auVar11._8_4_ = SUB84(dVar12,0);
          auVar11._0_8_ = local_48 * dVar6 + dVar14 * dVar4;
          auVar11._12_4_ = (int)((ulong)dVar12 >> 0x20);
          auVar11 = auVar11 ^ _DAT_00199030;
          dVar12 = local_48 * dVar3 - dVar14 * dVar5;
          auVar13._8_4_ = SUB84(dVar12,0);
          auVar13._0_8_ = local_48 * dVar4 - dVar14 * dVar6;
          auVar13._12_4_ = (int)((ulong)dVar12 >> 0x20);
          auVar13 = auVar13 ^ _DAT_00199020;
          pdVar7[3] = auVar13._0_8_ + dVar9 * dVar3 + dVar15 * dVar5;
          pdVar7[4] = auVar13._8_8_ + dVar9 * dVar4 + dVar15 * dVar6;
          pdVar7[5] = auVar11._0_8_ + (dVar9 * dVar5 - dVar15 * dVar3);
          pdVar7[6] = auVar11._8_8_ + (dVar9 * dVar6 - dVar15 * dVar4);
          if ((0xc < (stateVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_rows) &&
             (0xb < (tangentVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_rows)) {
            if (0xc < (sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_rows) {
              pdVar7 = (stateVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                       .m_storage.m_data;
              pdVar1 = (tangentVector->
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                       m_data;
              pdVar2 = (sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data;
              dVar9 = pdVar7[0xb];
              dVar12 = pdVar1[10];
              pdVar2[10] = pdVar1[9] + pdVar7[10];
              pdVar2[0xb] = dVar12 + dVar9;
              pdVar2[0xc] = pdVar7[0xc] + pdVar1[0xb];
              if (((stateVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_rows < 0x13) ||
                 ((tangentVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_rows < 0x12)) goto LAB_001491cd;
              if (0x12 < (sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_rows) {
                pdVar7 = (stateVector->
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                         m_data;
                pdVar1 = (tangentVector->
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                         m_data;
                pdVar2 = (sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data;
                dVar9 = pdVar7[0x11];
                dVar12 = pdVar1[0x10];
                pdVar2[0x10] = pdVar1[0xf] + pdVar7[0x10];
                pdVar2[0x11] = dVar12 + dVar9;
                pdVar2[0x12] = pdVar7[0x12] + pdVar1[0x11];
                return;
              }
            }
            goto LAB_001491e4;
          }
        }
      }
    }
  }
LAB_001491cd:
  __function = 
  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, 3, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
  ;
LAB_00149227:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

void IMUMltpctiveDynamicalSystem::stateSum(const Vector & stateVector, const Vector & tangentVector, Vector & sum)
{
  sum.resize(indexes::size);
  sum.segment<3>(indexes::pos) = stateVector.segment<3>(indexes::pos) + tangentVector.segment<3>(indexesTangent::pos);
  sum.segment<3>(indexes::linVel) =
      stateVector.segment<3>(indexes::linVel) + tangentVector.segment<3>(indexesTangent::linVel);
  sum.segment<3>(indexes::linAcc) =
      stateVector.segment<3>(indexes::linAcc) + tangentVector.segment<3>(indexesTangent::linAcc);

  sum.segment<4>(indexes::ori) = (kine::rotationVectorToQuaternion(tangentVector.segment<3>(indexesTangent::ori))
                                  * Quaternion(stateVector.segment<4>(indexes::ori)))
                                     .coeffs();
  sum.segment<3>(indexes::angVel) =
      stateVector.segment<3>(indexes::angVel) + tangentVector.segment<3>(indexesTangent::angVel);
  sum.segment<3>(indexes::angAcc) =
      stateVector.segment<3>(indexes::angAcc) + tangentVector.segment<3>(indexesTangent::angAcc);
}